

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void highbd_transpose8x8_high_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *d4,__m128i *d5,__m128i *d6,__m128i *d7)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  __m128i ww1;
  __m128i ww0;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  __m128i *x5_local;
  __m128i *x4_local;
  __m128i *x3_local;
  __m128i *x2_local;
  
  auVar1 = vpunpckhwd_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpckhwd_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  auVar3 = vpunpckhwd_avx((undefined1  [16])*x4,(undefined1  [16])*x5);
  auVar4 = vpunpckhwd_avx((undefined1  [16])*x6,(undefined1  [16])*x7);
  auVar5 = vpunpckldq_avx(auVar1,auVar2);
  auVar6 = vpunpckldq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar5,auVar6);
  *d4 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar5,auVar6);
  *d5 = alVar7;
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpcklqdq_avx(auVar1,auVar2);
  *d6 = alVar7;
  alVar7 = (__m128i)vpunpckhqdq_avx(auVar1,auVar2);
  *d7 = alVar7;
  return;
}

Assistant:

static inline void highbd_transpose8x8_high_sse2(__m128i *x0, __m128i *x1,
                                                 __m128i *x2, __m128i *x3,
                                                 __m128i *x4, __m128i *x5,
                                                 __m128i *x6, __m128i *x7,
                                                 __m128i *d4, __m128i *d5,
                                                 __m128i *d6, __m128i *d7) {
  __m128i w0, w1, w2, w3, ww0, ww1;
  // x0 00 01 02 03 04 05 06 07
  // x1 10 11 12 13 14 15 16 17
  // x2 20 21 22 23 24 25 26 27
  // x3 30 31 32 33 34 35 36 37
  // x4 40 41 42 43 44 45 46 47
  // x5 50 51 52 53 54 55 56 57
  // x6 60 61 62 63 64 65 66 67
  // x7 70 71 72 73 74 75 76 77
  w0 = _mm_unpackhi_epi16(*x0, *x1);  // 04 14 05 15 06 16 07 17
  w1 = _mm_unpackhi_epi16(*x2, *x3);  // 24 34 25 35 26 36 27 37
  w2 = _mm_unpackhi_epi16(*x4, *x5);  // 44 54 45 55 46 56 47 57
  w3 = _mm_unpackhi_epi16(*x6, *x7);  // 64 74 65 75 66 76 67 77

  ww0 = _mm_unpacklo_epi32(w0, w1);  // 04 14 24 34 05 15 25 35
  ww1 = _mm_unpacklo_epi32(w2, w3);  // 44 54 64 74 45 55 65 75

  *d4 = _mm_unpacklo_epi64(ww0, ww1);  // 04 14 24 34 44 54 64 74
  *d5 = _mm_unpackhi_epi64(ww0, ww1);  // 05 15 25 35 45 55 65 75

  ww0 = _mm_unpackhi_epi32(w0, w1);  // 06 16 26 36 07 17 27 37
  ww1 = _mm_unpackhi_epi32(w2, w3);  // 46 56 66 76 47 57 67 77

  *d6 = _mm_unpacklo_epi64(ww0, ww1);  // 06 16 26 36 46 56 66 76
  *d7 = _mm_unpackhi_epi64(ww0, ww1);  // 07 17 27 37 47 57 67 77
}